

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

string * __thiscall
libcellml::Importer::key_abi_cxx11_(string *__return_storage_ptr__,Importer *this,size_t *index)

{
  pointer puVar1;
  LoggerImpl *pLVar2;
  _Rb_tree_node_base *p_Var3;
  size_t sVar4;
  bool bVar5;
  allocator<char> local_21;
  
  puVar1 = (pointer)*index;
  pLVar2 = Logger::pFunc(&this->super_Logger);
  if (puVar1 < pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start) {
    pLVar2 = Logger::pFunc(&this->super_Logger);
    p_Var3 = (_Rb_tree_node_base *)
             pLVar2[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    sVar4 = *index;
    while (bVar5 = sVar4 != 0, sVar4 = sVar4 - 1, bVar5) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(p_Var3 + 1));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Importer::key(const size_t &index)
{
    if (index >= pFunc()->mLibrary.size()) {
        return "";
    }
    auto it = pFunc()->mLibrary.begin();
    size_t i = 0;
    while (i < index) {
        ++it;
        ++i;
    }
    return it->first;
}